

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unwind.c
# Opt level: O3

LispPTR * N_OP_unwind(LispPTR *cstkptr,LispPTR tos,int n,int keep)

{
  uint uVar1;
  ulong uVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  
  pLVar4 = (LispPTR *)(MachineState.pvar + (long)n * 2);
  if (cstkptr < pLVar4) {
    MachineState.errorexit = 1;
    pLVar3 = (LispPTR *)0xffffffffffffffff;
    MachineState.csp = (DLword *)cstkptr;
    MachineState.tosvalue = tos;
  }
  else {
    *cstkptr = tos;
    for (pLVar3 = cstkptr + 1; pLVar4 < pLVar3; pLVar3 = pLVar3 + -1) {
      uVar1 = pLVar3[-1];
      if (((int)uVar1 < 0) && ((int)uVar1 >> 0x10 != -1)) {
        uVar2 = (ulong)(-((int)uVar1 >> 0x10) - 2);
        memset(MachineState.pvar + uVar2 * -2 + (ulong)(uVar1 & 0xffff),0xff,uVar2 * 4 + 4);
      }
    }
    if (keep != 0) {
      *pLVar3 = tos;
      pLVar3 = pLVar3 + 1;
    }
  }
  return pLVar3;
}

Assistant:

LispPTR *N_OP_unwind(LispPTR *cstkptr, LispPTR tos, int n, int keep) {
  int num;           /* number of UNBOUND slot */
  LispPTR *endptr;   /* unwind limit */
  LispPTR *lastpvar; /* points PVar slot that is unbounded. */

  /* Slots:
          -----------------
          |		|	<- PVar
          -----------------
          |	.	|
          |	.	|
          -----------------
          |		|	 ALL OF THE FOLLOWING LOCATIONS SCANNED:
          -----------------------------------------------------------------
          | tos if keep	|	<- endptr (PVar[n]) <- Result (no keep)	|
          -----------------						|
          |		|	<- Result (keep)			|
          -----------------						|
          |		|						|
          -----------------						|
          |	.	|						|
          |	.	|						|
          -----------------						|
          |   tos pushed	|	<- Start CSTKPTR			|
          -----------------------------------------------------------------
          |		|	<- CSTKPTR temporarily bumped pushing tos
          -----------------

          NOTE: upon return the emulator does a POP to get the new tos value

  */

  endptr = (LispPTR *)PVar + n; /* set unwind limit */

  if (endptr > cstkptr) {
    CurrentStackPTR = (DLword *)cstkptr;
    /* this would be ERROR_EXIT(tos); but for having to return a pointer */
    TopOfStack = tos;
    Error_Exit = 1;
    return (LispPTR *)(-1);
  }
  *cstkptr++ = tos;

  /* UNBOUND MARK loop  */

  while (cstkptr > endptr) {
    /* Look for the Next BIND marker */

    if ((num = (int)*--cstkptr) < 0) {
      /* Now UNBIND the PVARS indicated by the BIND marker */

      lastpvar = (LispPTR *)(2 + PVar + (unsigned short)num);
      num = ~(num >> 16) + 1;
      for (; --num > 0;) { *--lastpvar = 0xffffffff; /* Mark as UNBOUND */ }
    }
  }

  /* endptr = cstkptr */

  if (keep) { *(cstkptr++) = tos; }
  return (cstkptr);

}